

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  string *this_00;
  pointer pcVar1;
  IResultCapture *pIVar2;
  long *local_58 [2];
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->m_info).macroName.field_2;
  (this->m_info).macroName._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (builder->m_info).macroName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (builder->m_info).macroName._M_string_length);
  (this->m_info).lineInfo.file._M_dataplus._M_p = (pointer)&(this->m_info).lineInfo.file.field_2;
  pcVar1 = (builder->m_info).lineInfo.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).lineInfo,pcVar1,
             pcVar1 + (builder->m_info).lineInfo.file._M_string_length);
  (this->m_info).lineInfo.line = (builder->m_info).lineInfo.line;
  (this->m_info).type = (builder->m_info).type;
  this_00 = &(this->m_info).message;
  (this->m_info).message._M_dataplus._M_p = (pointer)&(this->m_info).message.field_2;
  pcVar1 = (builder->m_info).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,pcVar1,pcVar1 + (builder->m_info).message._M_string_length);
  (this->m_info).sequence = (builder->m_info).sequence;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this_00,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  pIVar2 = getResultCapture();
  (*pIVar2->_vptr_IResultCapture[6])(pIVar2,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info )
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }